

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal.c
# Opt level: O0

int Qiniu_Is(Qiniu_Eq *self)

{
  Qiniu_Writer w;
  Qiniu_Error QVar1;
  bool local_41;
  Qiniu_Error err;
  Qiniu_Int64 ncopy;
  Qiniu_Eq *self_local;
  
  if (self->result == 0) {
    self_local._4_4_ = 0;
  }
  else {
    w.Write = Qiniu_Discard.Write;
    w.self = Qiniu_Discard.self;
    w.Flush = Qiniu_Discard.Flush;
    QVar1 = Qiniu_Copy(w,self->v,(void *)0x0,0x400,(Qiniu_Int64 *)&err.message);
    err._0_8_ = QVar1.message;
    Qiniu_Stderr_Info("Qiniu_Is: copy.n = %D, copy.err = %E",err.message,QVar1.code,err._0_8_);
    local_41 = QVar1.code == 200 && err.message == (char *)0x0;
    self_local._4_4_ = (uint)local_41;
  }
  return self_local._4_4_;
}

Assistant:

int Qiniu_Is(Qiniu_Eq *self)
{
	Qiniu_Int64 ncopy;
	Qiniu_Error err;
	if (self->result)
	{
		err = Qiniu_Copy(Qiniu_Discard, self->v, NULL, 1024, &ncopy);
		Qiniu_Log_Info("Qiniu_Is: copy.n = %D, copy.err = %E", ncopy, err);
		return err.code == 200 && ncopy == 0;
	}
	return 0;
}